

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall
Catch::TAPReporter::assertionEnded(TAPReporter *this,AssertionStats *_assertionStats)

{
  OfType OVar1;
  TestCaseInfo *pTVar2;
  ostream *poVar3;
  size_type sVar4;
  Code colour;
  char *pcVar5;
  StringRef passOrFail;
  StringRef passOrFail_00;
  StringRef passOrFail_01;
  StringRef passOrFail_02;
  StringRef passOrFail_03;
  StringRef passOrFail_04;
  StringRef passOrFail_05;
  StringRef passOrFail_06;
  StringRef passOrFail_07;
  TapAssertionPrinter printer;
  char local_59;
  TapAssertionPrinter local_58;
  
  this->counter = this->counter + 1;
  poVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# ",2);
  pTVar2 = (this->super_StreamingReporterBase).currentTestCaseInfo;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(pTVar2->name)._M_dataplus._M_p,(pTVar2->name)._M_string_length);
  local_58.stream = (ostream *)CONCAT71(local_58.stream._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_58,1);
  poVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  local_58.colourImpl = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
  local_58.counter = this->counter;
  local_58.messages = &_assertionStats->infoMessages;
  local_58.itMessage._M_current =
       (_assertionStats->infoMessages).
       super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_58.printInfoMessages = true;
  OVar1 = (_assertionStats->assertionResult).m_resultData.resultType;
  local_58.stream = poVar3;
  local_58.result = &_assertionStats->assertionResult;
  if (0x10f < OVar1) {
    if (OVar1 < DidntThrowException) {
      if (OVar1 == Exception) goto switchD_0015b785_caseD_ffffffff;
      if (OVar1 != ThrewException) goto switchD_0015b785_caseD_3;
      passOrFail_00.m_size = 6;
      passOrFail_00.m_start = "not ok";
      anon_unknown_26::TapAssertionPrinter::printResultType(&local_58,passOrFail_00);
      local_59 = ' ';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_59,1);
      pcVar5 = "unexpected exception with message:";
LAB_0015b885:
      std::ostream::write((char *)poVar3,(long)pcVar5);
      anon_unknown_26::TapAssertionPrinter::printMessage(&local_58);
    }
    else {
      if (OVar1 != DidntThrowException) {
        if (OVar1 != FatalErrorCondition) goto switchD_0015b785_caseD_3;
        passOrFail_02.m_size = 6;
        passOrFail_02.m_start = "not ok";
        anon_unknown_26::TapAssertionPrinter::printResultType(&local_58,passOrFail_02);
        local_59 = ' ';
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_59,1);
        pcVar5 = "fatal error condition with message:";
        goto LAB_0015b885;
      }
      passOrFail_06.m_size = 6;
      passOrFail_06.m_start = "not ok";
      anon_unknown_26::TapAssertionPrinter::printResultType(&local_58,passOrFail_06);
      local_59 = ' ';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_59,1);
      std::ostream::write((char *)poVar3,0x18169b);
    }
    anon_unknown_26::TapAssertionPrinter::printExpressionWas(&local_58);
    goto LAB_0015ba54;
  }
  switch(OVar1) {
  case Ok:
    passOrFail.m_size = 2;
    passOrFail.m_start = "ok";
    anon_unknown_26::TapAssertionPrinter::printResultType(&local_58,passOrFail);
    anon_unknown_26::TapAssertionPrinter::printOriginalExpression(&local_58);
    anon_unknown_26::TapAssertionPrinter::printReconstructedExpression(&local_58);
    if ((_assertionStats->assertionResult).m_info.capturedExpression.m_size != 0) break;
    goto LAB_0015b8df;
  case Info:
    pcVar5 = "info";
    sVar4 = 4;
    goto LAB_0015b935;
  case Warning:
    pcVar5 = "warning";
    sVar4 = 7;
LAB_0015b935:
    passOrFail_04.m_size = sVar4;
    passOrFail_04.m_start = pcVar5;
    anon_unknown_26::TapAssertionPrinter::printResultType(&local_58,passOrFail_04);
    anon_unknown_26::TapAssertionPrinter::printMessage(&local_58);
    break;
  default:
    goto switchD_0015b785_caseD_3;
  case ExplicitSkip:
    passOrFail_05.m_size = 2;
    passOrFail_05.m_start = "ok";
    anon_unknown_26::TapAssertionPrinter::printResultType(&local_58,passOrFail_05);
    local_59 = ' ';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_59,1);
    std::ostream::write((char *)poVar3,0x181952);
    anon_unknown_26::TapAssertionPrinter::printMessage(&local_58);
    break;
  case ExpressionFailed:
    if (((OVar1 & FailureBit) == Ok) ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) {
      pcVar5 = "ok";
      sVar4 = 2;
    }
    else {
      pcVar5 = "not ok";
      sVar4 = 6;
    }
    passOrFail_07.m_size = sVar4;
    passOrFail_07.m_start = pcVar5;
    anon_unknown_26::TapAssertionPrinter::printResultType(&local_58,passOrFail_07);
    anon_unknown_26::TapAssertionPrinter::printOriginalExpression(&local_58);
    anon_unknown_26::TapAssertionPrinter::printReconstructedExpression(&local_58);
    if ((((_assertionStats->assertionResult).m_resultData.resultType & FailureBit) == Ok) ||
       (((_assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)) {
      local_59 = ' ';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_59,1);
      std::ostream::write((char *)poVar3,0x18194a);
    }
    break;
  case ExplicitFailure:
    passOrFail_03.m_size = 6;
    passOrFail_03.m_start = "not ok";
    anon_unknown_26::TapAssertionPrinter::printResultType(&local_58,passOrFail_03);
    local_59 = ' ';
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,&local_59,1);
    std::ostream::write((char *)poVar3,0x1816c0);
LAB_0015b8df:
    colour = None;
    goto LAB_0015ba59;
  case Unknown:
  case FailureBit:
switchD_0015b785_caseD_ffffffff:
    passOrFail_01.m_size = 0x14;
    passOrFail_01.m_start = "** internal error **";
    anon_unknown_26::TapAssertionPrinter::printResultType(&local_58,passOrFail_01);
    goto switchD_0015b785_caseD_3;
  }
LAB_0015ba54:
  colour = FileName;
LAB_0015ba59:
  anon_unknown_26::TapAssertionPrinter::printRemainingMessages(&local_58,colour);
switchD_0015b785_caseD_3:
  local_59 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,&local_59,1);
  std::ostream::flush();
  return;
}

Assistant:

void TAPReporter::assertionEnded(AssertionStats const& _assertionStats) {
        ++counter;

        m_stream << "# " << currentTestCaseInfo->name << '\n';
        TapAssertionPrinter printer(m_stream, _assertionStats, counter, m_colour.get());
        printer.print();

        m_stream << '\n' << std::flush;
    }